

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

int Sfm_TimSortArrayByArrival(Sfm_Tim_t *p,Vec_Int_t *vNodes,int iPivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word *pData;
  word wVar4;
  int local_38;
  int MaxDelay;
  int nDivNew;
  int Time;
  int Id;
  int i;
  word Entry;
  int iPivot_local;
  Vec_Int_t *vNodes_local;
  Sfm_Tim_t *p_local;
  
  local_38 = -1;
  iVar1 = Sfm_TimArrMaxId(p,iPivot);
  if (p->DeltaCrit < 1) {
    __assert_fail("p->DeltaCrit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                  ,0x155,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  Vec_WrdClear(&p->vSortData);
  Time = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vNodes);
    if (iVar2 <= Time) {
      pData = Vec_WrdArray(&p->vSortData);
      iVar2 = Vec_WrdSize(&p->vSortData);
      Abc_QuickSort3(pData,iVar2,0);
      Vec_IntClear(vNodes);
      for (Time = 0; iVar2 = Vec_WrdSize(&p->vSortData), Time < iVar2; Time = Time + 1) {
        wVar4 = Vec_WrdEntry(&p->vSortData,Time);
        Vec_IntPush(vNodes,(int)(wVar4 >> 0x20));
        if ((local_38 == -1) && (iVar1 + 500000000 < (int)wVar4 + p->DeltaCrit)) {
          local_38 = Time;
        }
      }
      return local_38;
    }
    iVar2 = Vec_IntEntry(vNodes,Time);
    iVar3 = Sfm_TimArrMaxId(p,iVar2);
    if ((iVar3 < -499999999) || (499999999 < iVar3)) break;
    Vec_WrdPush(&p->vSortData,(long)iVar2 << 0x20 | (long)(iVar3 + 500000000));
    Time = Time + 1;
  }
  __assert_fail("-ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                ,0x15b,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
}

Assistant:

int Sfm_TimSortArrayByArrival( Sfm_Tim_t * p, Vec_Int_t * vNodes, int iPivot )
{
    word Entry; 
    int i, Id, Time, nDivNew = -1; 
    int MaxDelay = ABC_INFINITY/2+Sfm_TimArrMaxId(p, iPivot);
    assert( p->DeltaCrit > 0 );
    // collect nodes
    Vec_WrdClear( &p->vSortData );
    Vec_IntForEachEntry( vNodes, Id, i )
    {
        Time = Sfm_TimArrMaxId( p, Id );
        assert( -ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2 );
        Vec_WrdPush( &p->vSortData, ((word)Id << 32) | (ABC_INFINITY/2+Time) );
    }
    // sort nodes by delay
    Abc_QuickSort3( Vec_WrdArray(&p->vSortData), Vec_WrdSize(&p->vSortData), 0 );
    // collect sorted nodes and find place where divisors end
    Vec_IntClear( vNodes );
    Vec_WrdForEachEntry( &p->vSortData, Entry, i )
    {
        Vec_IntPush( vNodes, (int)(Entry >> 32) );
        if ( nDivNew == -1 && ((int)Entry) + p->DeltaCrit > MaxDelay )
            nDivNew = i;
    }
    return nDivNew;
}